

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O2

void __thiscall wasm::FunctionHasher::doWalkFunction(FunctionHasher *this,Function *func)

{
  size_t sVar1;
  mapped_type_conflict *pmVar2;
  function<bool_(wasm::Expression_*,_unsigned_long_&)> local_48;
  Function *local_28;
  Function *func_local;
  
  local_28 = func;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function(&local_48,&this->customHasher)
  ;
  sVar1 = flexibleHashFunction(func,&local_48);
  pmVar2 = std::
           map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
           ::at(&this->output->
                 super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                ,&local_28);
  *pmVar2 = sVar1;
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    output->at(func) = flexibleHashFunction(func, customHasher);
  }